

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

bool __thiscall wallet::SQLiteBatch::TxnBegin(SQLiteBatch *this)

{
  SQliteExecHandler *pSVar1;
  SQLiteDatabase *pSVar2;
  int iVar3;
  unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_> *puVar4;
  void *in_RSI;
  long in_FS_OFFSET;
  bool bVar5;
  string_view source_file;
  string_view logging_function;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_database->m_db != (sqlite3 *)0x0) && (this->m_txn == false)) {
    CSemaphore::wait(&this->m_database->m_write_semaphore,in_RSI);
    if (this->m_database->m_db == (sqlite3 *)0x0) {
      bVar5 = true;
    }
    else {
      iVar3 = sqlite3_get_autocommit();
      bVar5 = iVar3 != 0;
    }
    local_58[0] = (long *)CONCAT71(local_58[0]._1_7_,bVar5);
    inline_assertion_check<true,bool>
              ((bool *)local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
               ,0x28f,"TxnBegin","!m_database.HasActiveTxn()");
    puVar4 = inline_assertion_check<true,std::unique_ptr<wallet::SQliteExecHandler,std::default_delete<wallet::SQliteExecHandler>>&>
                       (&this->m_exec_handler,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                        ,0x290,"TxnBegin","m_exec_handler");
    pSVar1 = (puVar4->_M_t).
             super___uniq_ptr_impl<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::SQliteExecHandler_*,_std::default_delete<wallet::SQliteExecHandler>_>
             .super__Head_base<0UL,_wallet::SQliteExecHandler_*,_false>._M_head_impl;
    pSVar2 = this->m_database;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"BEGIN TRANSACTION","");
    iVar3 = (*pSVar1->_vptr_SQliteExecHandler[2])(pSVar1,pSVar2,local_58);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (iVar3 == 0) {
      this->m_txn = true;
      bVar5 = true;
      goto LAB_00c4e0a6;
    }
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x61;
    logging_function._M_str = "TxnBegin";
    logging_function._M_len = 8;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x292,ALL,Info,(ConstevalFormatString<0U>)0x10ec910);
    CSemaphore::post(&this->m_database->m_write_semaphore);
  }
  bVar5 = false;
LAB_00c4e0a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::TxnBegin()
{
    if (!m_database.m_db || m_txn) return false;
    m_database.m_write_semaphore.wait();
    Assert(!m_database.HasActiveTxn());
    int res = Assert(m_exec_handler)->Exec(m_database, "BEGIN TRANSACTION");
    if (res != SQLITE_OK) {
        LogPrintf("SQLiteBatch: Failed to begin the transaction\n");
        m_database.m_write_semaphore.post();
    } else {
        m_txn = true;
    }
    return res == SQLITE_OK;
}